

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O1

bool __thiscall draco::GeometryAttribute::operator==(GeometryAttribute *this,GeometryAttribute *va)

{
  Type TVar1;
  Type TVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar3[0] = -((char)va->byte_stride_ == (char)this->byte_stride_);
  auVar3[1] = -(*(char *)((long)&va->byte_stride_ + 1) == *(char *)((long)&this->byte_stride_ + 1));
  auVar3[2] = -(*(char *)((long)&va->byte_stride_ + 2) == *(char *)((long)&this->byte_stride_ + 2));
  auVar3[3] = -(*(char *)((long)&va->byte_stride_ + 3) == *(char *)((long)&this->byte_stride_ + 3));
  auVar3[4] = -(*(char *)((long)&va->byte_stride_ + 4) == *(char *)((long)&this->byte_stride_ + 4));
  auVar3[5] = -(*(char *)((long)&va->byte_stride_ + 5) == *(char *)((long)&this->byte_stride_ + 5));
  auVar3[6] = -(*(char *)((long)&va->byte_stride_ + 6) == *(char *)((long)&this->byte_stride_ + 6));
  auVar3[7] = -(*(char *)((long)&va->byte_stride_ + 7) == *(char *)((long)&this->byte_stride_ + 7));
  auVar3[8] = -((char)va->byte_offset_ == (char)this->byte_offset_);
  auVar3[9] = -(*(char *)((long)&va->byte_offset_ + 1) == *(char *)((long)&this->byte_offset_ + 1));
  auVar3[10] = -(*(char *)((long)&va->byte_offset_ + 2) == *(char *)((long)&this->byte_offset_ + 2))
  ;
  auVar3[0xb] = -(*(char *)((long)&va->byte_offset_ + 3) == *(char *)((long)&this->byte_offset_ + 3)
                 );
  auVar3[0xc] = -(*(char *)((long)&va->byte_offset_ + 4) == *(char *)((long)&this->byte_offset_ + 4)
                 );
  auVar3[0xd] = -(*(char *)((long)&va->byte_offset_ + 5) == *(char *)((long)&this->byte_offset_ + 5)
                 );
  auVar3[0xe] = -(*(char *)((long)&va->byte_offset_ + 6) == *(char *)((long)&this->byte_offset_ + 6)
                 );
  auVar3[0xf] = -(*(char *)((long)&va->byte_offset_ + 7) == *(char *)((long)&this->byte_offset_ + 7)
                 );
  TVar1 = this->attribute_type_;
  TVar2 = va->attribute_type_;
  auVar5[0] = -((char)TVar2 == (char)TVar1);
  auVar5[1] = -((char)((uint)TVar2 >> 8) == (char)((uint)TVar1 >> 8));
  auVar5[2] = -((char)((uint)TVar2 >> 0x10) == (char)((uint)TVar1 >> 0x10));
  auVar5[3] = -((char)((uint)TVar2 >> 0x18) == (char)((uint)TVar1 >> 0x18));
  auVar5[4] = 0xff;
  auVar5[5] = 0xff;
  auVar5[6] = 0xff;
  auVar5[7] = 0xff;
  auVar5[8] = 0xff;
  auVar5[9] = 0xff;
  auVar5[10] = 0xff;
  auVar5[0xb] = 0xff;
  auVar5[0xc] = 0xff;
  auVar5[0xd] = 0xff;
  auVar5[0xe] = 0xff;
  auVar5[0xf] = 0xff;
  auVar5 = auVar5 & auVar3;
  if (((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) &&
     (auVar4[0] = -((char)(va->buffer_descriptor_).buffer_id ==
                   (char)(this->buffer_descriptor_).buffer_id),
     auVar4[1] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 1) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 1)),
     auVar4[2] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 2) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 2)),
     auVar4[3] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 3) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 3)),
     auVar4[4] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 4) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 4)),
     auVar4[5] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 5) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 5)),
     auVar4[6] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 6) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 6)),
     auVar4[7] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_id + 7) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_id + 7)),
     auVar4[8] = -((char)(va->buffer_descriptor_).buffer_update_count ==
                  (char)(this->buffer_descriptor_).buffer_update_count),
     auVar4[9] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 1) ==
                  *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 1)),
     auVar4[10] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 2) ==
                   *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 2)),
     auVar4[0xb] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 3) ==
                    *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 3)),
     auVar4[0xc] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 4) ==
                    *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 4)),
     auVar4[0xd] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 5) ==
                    *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 5)),
     auVar4[0xe] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 6) ==
                    *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 6)),
     auVar4[0xf] = -(*(char *)((long)&(va->buffer_descriptor_).buffer_update_count + 7) ==
                    *(char *)((long)&(this->buffer_descriptor_).buffer_update_count + 7)),
     auVar6[0] = -(va->num_components_ == this->num_components_), auVar6[1] = 0xff, auVar6[2] = 0xff
     , auVar6[3] = 0xff, auVar6[4] = 0xff, auVar6[5] = 0xff, auVar6[6] = 0xff, auVar6[7] = 0xff,
     auVar6[8] = 0xff, auVar6[9] = 0xff, auVar6[10] = 0xff, auVar6[0xb] = 0xff, auVar6[0xc] = 0xff,
     auVar6[0xd] = 0xff, auVar6[0xe] = 0xff, auVar6[0xf] = 0xff, auVar6 = auVar6 & auVar4,
     (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) {
    return this->data_type_ == va->data_type_;
  }
  return false;
}

Assistant:

bool GeometryAttribute::operator==(const GeometryAttribute &va) const {
  if (attribute_type_ != va.attribute_type_) {
    return false;
  }
  // It's OK to compare just the buffer descriptors here. We don't need to
  // compare the buffers themselves.
  if (buffer_descriptor_.buffer_id != va.buffer_descriptor_.buffer_id) {
    return false;
  }
  if (buffer_descriptor_.buffer_update_count !=
      va.buffer_descriptor_.buffer_update_count) {
    return false;
  }
  if (num_components_ != va.num_components_) {
    return false;
  }
  if (data_type_ != va.data_type_) {
    return false;
  }
  if (byte_stride_ != va.byte_stride_) {
    return false;
  }
  if (byte_offset_ != va.byte_offset_) {
    return false;
  }
  return true;
}